

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

sexp_conflict
sexp_string_hash(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict str,
                sexp_conflict bound)

{
  sexp_uint_t acc;
  sexp_conflict psVar1;
  ulong uVar2;
  char *pcVar3;
  
  if ((((ulong)str & 3) == 0) && (str->tag == 9)) {
    if (((ulong)bound & 1) == 0) {
      psVar1 = (sexp_conflict)sexp_type_exception(ctx,self,2,bound);
      return psVar1;
    }
    uVar2 = 0x811c9dc5;
    for (pcVar3 = (((str->value).type.name)->value).flonum_bits +
                  (long)(((str->value).type.cpl)->value).flonum_bits; (long)*pcVar3 != 0;
        pcVar3 = pcVar3 + 1) {
      uVar2 = uVar2 * 0x1000193 ^ (long)*pcVar3;
    }
    return (sexp_conflict)((uVar2 % (ulong)((long)bound >> 1)) * 2 + 1);
  }
  psVar1 = (sexp_conflict)sexp_type_exception(ctx,self,9);
  return psVar1;
}

Assistant:

sexp sexp_string_hash (sexp ctx, sexp self, sexp_sint_t n, sexp str, sexp bound) {
  if (! sexp_stringp(str))
    return sexp_type_exception(ctx, self, SEXP_STRING, str);
  else if (! sexp_fixnump(bound))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, bound);
  return sexp_make_fixnum(string_hash(sexp_string_data(str),
                                      sexp_unbox_fixnum(bound)));
}